

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unify_const_pass.cpp
# Opt level: O0

Node * __thiscall
spvtools::opt::anon_unknown_8::ResultIdTrie::Node::GetOrCreateTrieNodeFor(Node *this,uint32_t key)

{
  bool bVar1;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_unique_ptr<Node>_>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  local_58;
  pair<unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>
  local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
  local_40;
  undefined1 local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
  local_28;
  iterator iter;
  uint32_t key_local;
  Node *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
  ._M_cur._4_4_ = key;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>_>
       ::find(&this->next_,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>_>
       ::end(&this->next_);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    MakeUnique<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>();
    std::
    make_pair<unsigned_int&,std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>>>
              (&local_50.first,
               (unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                *)((long)&iter.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                          ._M_cur + 4));
    _Var3 = std::
            unordered_map<unsigned_int,std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>>>>>
            ::
            insert<std::pair<unsigned_int,std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>>>>
                      ((unordered_map<unsigned_int,std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>>>>>
                        *)&this->next_,&local_50);
    local_40._M_cur =
         (__node_type *)
         _Var3.first.
         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
         ._M_cur;
    local_38 = _Var3.second;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false,_false>
                           *)&local_40);
    this_local = std::
                 unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                 ::get(&ppVar2->second);
    std::
    pair<unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>
    ::~pair(&local_50);
    std::
    unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
    ::~unique_ptr(&local_58);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false,_false>
                           *)&local_28);
    this_local = std::
                 unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                 ::get(&ppVar2->second);
  }
  return this_local;
}

Assistant:

Node* GetOrCreateTrieNodeFor(uint32_t key) {
      auto iter = next_.find(key);
      if (iter == next_.end()) {
        // insert a new node and return the node.
        return next_.insert(std::make_pair(key, MakeUnique<Node>()))
            .first->second.get();
      }
      return iter->second.get();
    }